

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pose.cc
# Opt level: O2

Vector6d *
gmath::combineError(Vector6d *__return_storage_ptr__,Vector6d *pose0,Vector6d *pose1,
                   Vector6d *pose0_err,Vector6d *pose1_err)

{
  int k;
  long lVar1;
  int i_1;
  int i;
  long lVar2;
  double dVar3;
  Vector6d p;
  Vector6d pose;
  SVector<double,_6> local_f0;
  Vector6d local_c0;
  Vector6d local_90;
  Vector6d local_60;
  
  combine(&local_c0,pose0,pose1);
  SVector<double,_6>::SVector(__return_storage_ptr__);
  for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
    SVector<double,_6>::SVector(&local_f0,pose0);
    local_f0.v[lVar2] = pose0_err->v[lVar2] + local_f0.v[lVar2];
    combine(&local_90,&local_f0,pose1);
    anon_unknown_5::diff(&local_60,&local_90,&local_c0);
    SVector<double,_6>::operator=(&local_f0,&local_60);
    for (lVar1 = 0; lVar1 != 6; lVar1 = lVar1 + 1) {
      __return_storage_ptr__->v[lVar1] =
           local_f0.v[lVar1] * local_f0.v[lVar1] + __return_storage_ptr__->v[lVar1];
    }
  }
  for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
    SVector<double,_6>::SVector(&local_f0,pose1);
    local_f0.v[lVar2] = pose1_err->v[lVar2] + local_f0.v[lVar2];
    combine(&local_90,pose0,&local_f0);
    anon_unknown_5::diff(&local_60,&local_90,&local_c0);
    SVector<double,_6>::operator=(&local_f0,&local_60);
    for (lVar1 = 0; lVar1 != 6; lVar1 = lVar1 + 1) {
      __return_storage_ptr__->v[lVar1] =
           local_f0.v[lVar1] * local_f0.v[lVar1] + __return_storage_ptr__->v[lVar1];
    }
  }
  for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
    dVar3 = __return_storage_ptr__->v[lVar2];
    if (dVar3 < 0.0) {
      dVar3 = sqrt(dVar3);
    }
    else {
      dVar3 = SQRT(dVar3);
    }
    __return_storage_ptr__->v[lVar2] = dVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

Vector6d combineError(const Vector6d &pose0, const Vector6d &pose1,
                      const Vector6d &pose0_err, const Vector6d &pose1_err)
{
  Vector6d pose=combine(pose0, pose1);
  Vector6d perr;

  for (int i=0; i<6; i++)
  {
    Vector6d p=pose0;
    p[i]+=pose0_err[i];

    p=diff(combine(p, pose1), pose);

    for (int k=0; k<6; k++)
    {
      perr[k]+=p[k]*p[k];
    }
  }

  for (int i=0; i<6; i++)
  {
    Vector6d p=pose1;
    p[i]+=pose1_err[i];

    p=diff(combine(pose0, p), pose);

    for (int k=0; k<6; k++)
    {
      perr[k]+=p[k]*p[k];
    }
  }

  for (int i=0; i<6; i++)
  {
    perr[i]=sqrt(perr[i]);
  }

  return perr;
}